

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O3

void archive_entry_sparse_add_entry(archive_entry *entry,int64_t offset,int64_t length)

{
  ae_sparse *paVar1;
  int64_t iVar2;
  ae_sparse *paVar3;
  long lVar4;
  
  if ((long)(length ^ 0x7fffffffffffffffU) < offset || (length | offset) < 0) {
    return;
  }
  iVar2 = archive_entry_size(entry);
  if (iVar2 < length + offset) {
    return;
  }
  paVar1 = entry->sparse_tail;
  if (paVar1 != (ae_sparse *)0x0) {
    lVar4 = paVar1->offset + paVar1->length;
    if (offset < lVar4) {
      return;
    }
    if (lVar4 == offset) {
      paVar1->length = paVar1->length + length;
      return;
    }
  }
  paVar3 = (ae_sparse *)malloc(0x18);
  if (paVar3 != (ae_sparse *)0x0) {
    paVar3->offset = offset;
    paVar3->length = length;
    paVar3->next = (ae_sparse *)0x0;
    if (entry->sparse_head == (ae_sparse *)0x0) {
      entry->sparse_tail = paVar3;
      entry->sparse_head = paVar3;
    }
    else {
      if (paVar1 != (ae_sparse *)0x0) {
        paVar1->next = paVar3;
      }
      entry->sparse_tail = paVar3;
    }
  }
  return;
}

Assistant:

void
archive_entry_sparse_add_entry(struct archive_entry *entry,
	int64_t offset, int64_t length)
{
	struct ae_sparse *sp;

	if (offset < 0 || length < 0)
		/* Invalid value */
		return;
	if (offset > INT64_MAX - length ||
	    offset + length > archive_entry_size(entry))
		/* A value of "length" parameter is too large. */
		return;
	if ((sp = entry->sparse_tail) != NULL) {
		if (sp->offset + sp->length > offset)
			/* Invalid value. */
			return;
		if (sp->offset + sp->length == offset) {
			if (sp->offset + sp->length + length < 0)
				/* A value of "length" parameter is
				 * too large. */
				return;
			/* Expand existing sparse block size. */
			sp->length += length;
			return;
		}
	}

	if ((sp = (struct ae_sparse *)malloc(sizeof(*sp))) == NULL)
		/* XXX Error XXX */
		return;

	sp->offset = offset;
	sp->length = length;
	sp->next = NULL;

	if (entry->sparse_head == NULL)
		entry->sparse_head = entry->sparse_tail = sp;
	else {
		/* Add a new sparse block to the tail of list. */
		if (entry->sparse_tail != NULL)
			entry->sparse_tail->next = sp;
		entry->sparse_tail = sp;
	}
}